

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

FastString __thiscall Strings::unquotedPrintable(Strings *this,FastString *textToUnquote)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uchar *extraout_RDX;
  FastString FVar4;
  char local_51;
  char *pcStack_50;
  char ch;
  char *end;
  char *text;
  QuotedDecoding local_30;
  QuotedDecoding dec;
  FastString out;
  FastString *textToUnquote_local;
  
  Bstrlib::String::String((String *)&dec);
  QuotedDecoding::QuotedDecoding(&local_30,(String *)&dec);
  pcVar3 = Bstrlib::String::operator_cast_to_char_(textToUnquote);
  end = pcVar3;
  iVar2 = Bstrlib::String::getLength(textToUnquote);
  pcStack_50 = pcVar3 + iVar2;
  do {
    if (pcStack_50 <= end) {
      Bstrlib::String::String((String *)this,(String *)&dec);
LAB_00120cf4:
      Bstrlib::String::~String((String *)&dec);
      FVar4.super_tagbstring.data = extraout_RDX;
      FVar4.super_tagbstring._0_8_ = this;
      return (FastString)FVar4.super_tagbstring;
    }
    local_51 = '\0';
    bVar1 = QuotedDecoding::unquoteChar(&local_30,&end,&local_51);
    if (!bVar1) {
      Bstrlib::String::String((String *)this,"");
      goto LAB_00120cf4;
    }
    Bstrlib::String::operator+=((String *)&dec,local_51);
  } while( true );
}

Assistant:

FastString unquotedPrintable(const FastString & textToUnquote)
    {
        FastString out; QuotedDecoding dec(out);
        const char * text = (const char *)textToUnquote, *end = text + textToUnquote.getLength();
        while (text < end)
        {
            char ch = 0;
            if (!dec.unquoteChar(text, ch)) return "";
            out += ch;
        }
        return out;
    }